

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O1

void __thiscall
absl::strings_internal::BigUnsigned<4>::MultiplyByFiveToTheNth(BigUnsigned<4> *this,int n)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = n;
  if (0xc < n) {
    do {
      MultiplyBy(this,0x48c27395);
      n = uVar2 - 0xd;
      bVar1 = 0x19 < (int)uVar2;
      uVar2 = n;
    } while (bVar1);
  }
  if (n < 1) {
    return;
  }
  MultiplyBy(this,*(uint32_t *)(kFiveToNth + (ulong)(uint)n * 4));
  return;
}

Assistant:

void MultiplyByFiveToTheNth(int n) {
    while (n >= kMaxSmallPowerOfFive) {
      MultiplyBy(kFiveToNth[kMaxSmallPowerOfFive]);
      n -= kMaxSmallPowerOfFive;
    }
    if (n > 0) {
      MultiplyBy(kFiveToNth[n]);
    }
  }